

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O2

h__Writer * __thiscall
AS_02::PCM::MXFWriter::h__Writer::SetSourceStream(h__Writer *this,Rational *edit_rate)

{
  Rational RVar1;
  Rational *pRVar2;
  undefined8 *puVar3;
  undefined1 local_e0 [17];
  Rational RStack_cf;
  string local_c0;
  undefined1 local_a0 [104];
  Rational local_38;
  undefined1 local_30;
  undefined8 local_2f;
  undefined8 uStack_27;
  
  if (edit_rate[0x6e].Numerator == 1) {
    pRVar2 = (Rational *)ASDCP::Dictionary::Type(edit_rate[1].Numerator);
    RVar1 = pRVar2[1];
    edit_rate[0xb9] = *pRVar2;
    edit_rate[0xba] = RVar1;
    *(undefined1 *)((long)&edit_rate[0xba].Denominator + 3) = 1;
    ASDCP::MXF::h__WriterState::Goto_READY((h__WriterState *)this);
    if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                      super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                      super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
      RVar1 = edit_rate[0xb8];
      if (RVar1 == (Rational)0x0) {
        __assert_fail("m_WaveAudioDescriptor",
                      "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                      ,0x1a6,
                      "ASDCP::Result_t AS_02::PCM::MXFWriter::h__Writer::SetSourceStream(const ASDCP::Rational &)"
                     );
      }
      edit_rate[0xbb].Numerator =
           (*(uint *)((long)RVar1 + 0x16c) >> 3) * *(int *)((long)RVar1 + 0x168);
      puVar3 = (undefined8 *)ASDCP::Dictionary::Type(edit_rate[1].Numerator);
      local_c0._M_string_length._0_1_ = 1;
      local_c0._9_8_ = *puVar3;
      local_c0.field_2._1_8_ = puVar3[1];
      local_c0._M_dataplus._M_p = (pointer)&PTR__IArchive_00168cc8;
      local_e0[8] = true;
      local_e0._9_8_ = edit_rate[0xb9];
      RStack_cf = edit_rate[0xba];
      local_e0._0_8_ = &PTR__IArchive_00168cc8;
      puVar3 = (undefined8 *)ASDCP::Dictionary::Type(edit_rate[1].Numerator);
      local_30 = 1;
      local_2f = *puVar3;
      uStack_27 = puVar3[1];
      local_38 = (Rational)&PTR__IArchive_00168cc8;
      h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>::WriteAS02Header
                ((h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR> *)local_a0,(string *)edit_rate,
                 (UL *)&PCM_PACKAGE_LABEL_abi_cxx11_,&local_c0,(UL *)&SOUND_DEF_LABEL_abi_cxx11_,
                 (UL *)local_e0,&local_38,
                 (vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *)((long)edit_rate[99] + 0xf0));
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_a0);
      Kumu::Result_t::~Result_t((Result_t *)local_a0);
      if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                        super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                        super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
        RVar1 = edit_rate[0xb8];
        local_a0._0_4_ = (*(uint *)((long)RVar1 + 0x16c) >> 3) * *(int *)((long)RVar1 + 0x168);
        MXF::AS02IndexWriterCBR::SetEditRate
                  ((AS02IndexWriterCBR *)(edit_rate + 0x89),(Rational *)((long)RVar1 + 0x158),
                   (ui32_t *)local_a0);
      }
    }
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::h__Writer::SetSourceStream(const ASDCP::Rational& edit_rate)
{
  if ( ! m_State.Test_INIT() )
    {
      return RESULT_STATE;
    }

  memcpy(m_EssenceUL, m_Dict->ul(MDD_WAVEssenceClip), SMPTE_UL_LENGTH);
  m_EssenceUL[15] = 1; // set the stream identifier
  Result_t result = m_State.Goto_READY();

  if ( KM_SUCCESS(result) )
    {
      assert(m_WaveAudioDescriptor);
      m_BytesPerSample = AS_02::MXF::CalcSampleSize(*m_WaveAudioDescriptor);
      result = WriteAS02Header(PCM_PACKAGE_LABEL, UL(m_Dict->ul(MDD_WAVWrappingClip)),
			       SOUND_DEF_LABEL, UL(m_EssenceUL), UL(m_Dict->ul(MDD_SoundDataDef)),
			       m_EssenceDescriptor->SampleRate);

      if ( KM_SUCCESS(result) )
	{
	  this->m_IndexWriter.SetEditRate(m_WaveAudioDescriptor->AudioSamplingRate,
					  AS_02::MXF::CalcSampleSize(*m_WaveAudioDescriptor));
	}
    }

  return result;
}